

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

CESkyCoord * __thiscall
CESkyCoord::ConvertTo
          (CESkyCoord *__return_storage_ptr__,CESkyCoord *this,CESkyCoordType *output_coord_type,
          CEDate *date,CEObserver *observer)

{
  CESkyCoord CStack_58;
  
  CESkyCoord(__return_storage_ptr__);
  switch(*output_coord_type) {
  case CIRS:
    ConvertToCIRS(&CStack_58,this,date,observer);
    operator=(__return_storage_ptr__,&CStack_58);
    break;
  case ICRS:
    ConvertToICRS(&CStack_58,this,date,observer);
    operator=(__return_storage_ptr__,&CStack_58);
    break;
  case GALACTIC:
    ConvertToGalactic(&CStack_58,this,date,observer);
    operator=(__return_storage_ptr__,&CStack_58);
    break;
  case OBSERVED:
    ConvertToObserved(&CStack_58,this,date,observer);
    operator=(__return_storage_ptr__,&CStack_58);
    break;
  case ECLIPTIC:
    ConvertToEcliptic(&CStack_58,this,date,observer);
    operator=(__return_storage_ptr__,&CStack_58);
    break;
  default:
    goto switchD_0014ec0f_default;
  }
  ~CESkyCoord(&CStack_58);
switchD_0014ec0f_default:
  return __return_storage_ptr__;
}

Assistant:

CESkyCoord CESkyCoord::ConvertTo(const CESkyCoordType&  output_coord_type, 
                                 const CEDate&     date,
                                 const CEObserver& observer)
{
    // Do conversion to CIRS
    CESkyCoord coord;
    if (output_coord_type == CESkyCoordType::CIRS) {
        coord = ConvertToCIRS(date, observer);
    } else if (output_coord_type == CESkyCoordType::ICRS) {
        coord = ConvertToICRS(date, observer);
    } else if (output_coord_type == CESkyCoordType::GALACTIC) {
        coord = ConvertToGalactic(date, observer);
    } else if (output_coord_type == CESkyCoordType::OBSERVED) {
        coord = ConvertToObserved(date, observer);
    } else if (output_coord_type == CESkyCoordType::ECLIPTIC) {
        coord = ConvertToEcliptic(date, observer);
    }

    return coord;
}